

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TextureBufferActiveUniformValidation::iterate(TextureBufferActiveUniformValidation *this)

{
  _Rb_tree_header *p_Var1;
  GLenum GVar2;
  pointer pcVar3;
  void *pvVar4;
  pointer puVar5;
  undefined1 auVar6 [8];
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  size_t sVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  uint uVar15;
  ulong uVar16;
  pointer pTVar17;
  GLint n_active_uniforms;
  GLenum paramVal;
  uint local_248;
  key_type local_244;
  GLenum uniformType;
  GLint type;
  char *local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indicies;
  vector<int,_std::allocator<int>_> types;
  GLsizei uniformSize;
  GLsizei paramLength;
  long local_1f0;
  vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *local_1e8;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  resultTypes;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])();
  iVar7 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  (**(code **)(lVar9 + 0x1680))(this->m_po_id);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0xe3);
  local_1e8 = &this->m_texture_params;
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,local_1e8,this->m_tbo_tex_ids);
  (**(code **)(lVar9 + 0x9d8))(this->m_po_id,0x8b86,&n_active_uniforms);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"Error getting value of GL_ACTIVE_UNIFORMS!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0xec);
  local_248 = 0xaaaaaa01;
  if (((long)(this->m_texture_params).
             super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_texture_params).
             super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 -
      (ulong)(uint)n_active_uniforms != 0) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Result is different than expected!\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Expected number of active uniforms: ",0x24);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Result   number of active uniforms: ",0x24);
    std::ostream::operator<<((ostringstream *)&local_1a8,n_active_uniforms);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    local_248 = 0;
  }
  local_238 = (char *)operator_new(100);
  local_238[0] = '\0';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_238[4] = '\0';
  local_238[5] = '\0';
  local_238[6] = '\0';
  local_238[7] = '\0';
  local_238[8] = '\0';
  local_238[9] = '\0';
  local_238[10] = '\0';
  local_238[0xb] = '\0';
  local_238[0xc] = '\0';
  local_238[0xd] = '\0';
  local_238[0xe] = '\0';
  local_238[0xf] = '\0';
  local_238[0x10] = '\0';
  local_238[0x11] = '\0';
  local_238[0x12] = '\0';
  local_238[0x13] = '\0';
  local_238[0x14] = '\0';
  local_238[0x15] = '\0';
  local_238[0x16] = '\0';
  local_238[0x17] = '\0';
  local_238[0x18] = '\0';
  local_238[0x19] = '\0';
  local_238[0x1a] = '\0';
  local_238[0x1b] = '\0';
  local_238[0x1c] = '\0';
  local_238[0x1d] = '\0';
  local_238[0x1e] = '\0';
  local_238[0x1f] = '\0';
  local_238[0x20] = '\0';
  local_238[0x21] = '\0';
  local_238[0x22] = '\0';
  local_238[0x23] = '\0';
  local_238[0x24] = '\0';
  local_238[0x25] = '\0';
  local_238[0x26] = '\0';
  local_238[0x27] = '\0';
  local_238[0x28] = '\0';
  local_238[0x29] = '\0';
  local_238[0x2a] = '\0';
  local_238[0x2b] = '\0';
  local_238[0x2c] = '\0';
  local_238[0x2d] = '\0';
  local_238[0x2e] = '\0';
  local_238[0x2f] = '\0';
  local_238[0x30] = '\0';
  local_238[0x31] = '\0';
  local_238[0x32] = '\0';
  local_238[0x33] = '\0';
  local_238[0x34] = '\0';
  local_238[0x35] = '\0';
  local_238[0x36] = '\0';
  local_238[0x37] = '\0';
  local_238[0x38] = '\0';
  local_238[0x39] = '\0';
  local_238[0x3a] = '\0';
  local_238[0x3b] = '\0';
  local_238[0x3c] = '\0';
  local_238[0x3d] = '\0';
  local_238[0x3e] = '\0';
  local_238[0x3f] = '\0';
  local_238[0x40] = '\0';
  local_238[0x41] = '\0';
  local_238[0x42] = '\0';
  local_238[0x43] = '\0';
  local_238[0x44] = '\0';
  local_238[0x45] = '\0';
  local_238[0x46] = '\0';
  local_238[0x47] = '\0';
  local_238[0x48] = '\0';
  local_238[0x49] = '\0';
  local_238[0x4a] = '\0';
  local_238[0x4b] = '\0';
  local_238[0x4c] = '\0';
  local_238[0x4d] = '\0';
  local_238[0x4e] = '\0';
  local_238[0x4f] = '\0';
  local_238[0x50] = '\0';
  local_238[0x51] = '\0';
  local_238[0x52] = '\0';
  local_238[0x53] = '\0';
  local_238[0x54] = '\0';
  local_238[0x55] = '\0';
  local_238[0x56] = '\0';
  local_238[0x57] = '\0';
  local_238[0x58] = '\0';
  local_238[0x59] = '\0';
  local_238[0x5a] = '\0';
  local_238[0x5b] = '\0';
  local_238[0x5c] = '\0';
  local_238[0x5d] = '\0';
  local_238[0x5e] = '\0';
  local_238[0x5f] = '\0';
  local_238[0x60] = '\0';
  local_238[0x61] = '\0';
  local_238[0x62] = '\0';
  local_238[99] = '\0';
  paramLength = 0;
  uniformSize = 0;
  p_Var1 = &resultTypes._M_t._M_impl.super__Rb_tree_header;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0;
  local_1f0 = lVar9;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (n_active_uniforms != 0) {
    do {
      lVar9 = local_1f0;
      (**(code **)(local_1f0 + 0x750))
                (this->m_po_id,
                 (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,99,&paramLength,&uniformSize,&uniformType,
                 local_238);
      dVar8 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar8,"Error getting information about active uniform variable!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                      ,0x106);
      pTVar17 = (this->m_texture_params).
                super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = (long)(this->m_texture_params).
                    super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar17;
      if (lVar9 != 0) {
        uVar10 = (lVar9 >> 4) * -0x5555555555555555;
        uVar15 = 1;
        uVar16 = 0;
        do {
          if (pTVar17[uVar16].m_texture_uniform_type == uniformType) {
            pTVar17 = pTVar17 + uVar16;
            goto LAB_00d5aa32;
          }
          uVar16 = (ulong)uVar15;
          uVar15 = uVar15 + 1;
        } while (uVar16 <= uVar10 && uVar10 - uVar16 != 0);
      }
      pTVar17 = (pointer)0x0;
LAB_00d5aa32:
      if (pTVar17 == (pointer)0x0) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Following uniform type was not expected to be defined in current program : \n",
                   0x4c);
        pcVar11 = getUniformTypeName(this,uniformType);
        sVar12 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar11,sVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00d5ac9a:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        local_248 = 0;
      }
      else {
        pcVar3 = (pTVar17->m_uniform_name)._M_dataplus._M_p;
        local_1b0 = (undefined1  [8])local_1a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b0,pcVar3,pcVar3 + (pTVar17->m_uniform_name)._M_string_length);
        auVar6 = local_1b0;
        iVar7 = strncmp(local_238,(char *)local_1b0,100);
        if (auVar6 != (undefined1  [8])local_1a0) {
          operator_delete((void *)auVar6,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
        }
        if (iVar7 != 0) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"For :",5);
          pcVar11 = getUniformTypeName(this,uniformType);
          sVar12 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar11,sVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8," type name \n",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"expected  uniform name is: ",0x1b);
          indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          pcVar3 = (pTVar17->m_uniform_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&indicies,pcVar3,pcVar3 + (pTVar17->m_uniform_name)._M_string_length)
          ;
          puVar5 = indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
          }
          else {
            sVar12 = strlen((char *)indicies.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(char *)puVar5,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"result    uniform name is: ",0x1b);
          pcVar11 = local_238;
          sVar12 = strlen(local_238);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar11,sVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((pointer *)
              indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)indicies.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          goto LAB_00d5ac9a;
        }
      }
      GVar2 = uniformType;
      pmVar13 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&resultTypes,(key_type *)&types);
      *pmVar13 = GVar2;
      types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
      _0_4_ = (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
    } while ((uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start < (uint)n_active_uniforms);
  }
  if (n_active_uniforms != 0) {
    uVar10 = 0;
    do {
      p_Var14 = resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          p_Var1) {
        GVar2 = (local_1e8->
                super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar10].m_texture_uniform_type;
        do {
          if (*(GLenum *)&p_Var14[1].field_0x4 == GVar2) break;
          p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
        } while ((_Rb_tree_header *)p_Var14 != p_Var1);
      }
      if ((_Rb_tree_header *)p_Var14 == p_Var1) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Following uniform type is missing from active uniforms list: ",0x3d);
        pcVar11 = getUniformTypeName(this,(this->m_texture_params).
                                          super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                          m_texture_uniform_type);
        sVar12 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar11,sVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        local_248 = 0;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (uint)n_active_uniforms);
  }
  lVar9 = local_1f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&indicies,(long)n_active_uniforms,(allocator_type *)local_1b0);
  std::vector<int,_std::allocator<int>_>::vector
            (&types,(long)n_active_uniforms,(allocator_type *)local_1b0);
  if (n_active_uniforms != 0) {
    uVar10 = 0;
    do {
      indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10] = (uint)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar10 < (uint)n_active_uniforms);
  }
  (**(code **)(lVar9 + 0x770))
            (this->m_po_id,n_active_uniforms,
             indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x8a37,
             CONCAT44(types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start));
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"Error getting information about active uniform variables!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0x142);
  paramVal = 0;
  if (n_active_uniforms != 0) {
    do {
      pmVar13 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&resultTypes,&paramVal);
      if (*pmVar13 !=
          *(mapped_type *)
           (CONCAT44(types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) + (ulong)paramVal * 4)) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Wrong uniform type for index(",0x1d);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"expected uniform type: ",0x17);
        pmVar13 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[](&resultTypes,&paramVal);
        pcVar11 = getUniformTypeName(this,*pmVar13);
        sVar12 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar11,sVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"result   uniform type: ",0x17);
        pcVar11 = getUniformTypeName(this,*(GLenum *)
                                           (CONCAT44(types.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)types.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) +
                                           (ulong)paramVal * 4));
        sVar12 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar11,sVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        local_248 = 0;
      }
      paramVal = paramVal + 1;
    } while (paramVal < (uint)n_active_uniforms);
  }
  paramVal = 0x92fa;
  type = -1;
  local_244 = 0;
  if (n_active_uniforms != 0) {
    do {
      (**(code **)(lVar9 + 0x9c8))(this->m_po_id,0x92e1,local_244,1,&paramVal,1,0,&type);
      dVar8 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar8,"Error getting information about one of program resources!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                      ,0x159);
      pmVar13 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&resultTypes,&local_244);
      if (*pmVar13 != type) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Wrong uniform type for index(",0x1d);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"expected uniform type: ",0x17);
        pmVar13 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[](&resultTypes,&local_244);
        pcVar11 = getUniformTypeName(this,*pmVar13);
        sVar12 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar11,sVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"result   uniform type: ",0x17);
        pcVar11 = getUniformTypeName(this,type);
        sVar12 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar11,sVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        local_248 = 0;
      }
      local_244 = local_244 + 1;
    } while (local_244 < (uint)n_active_uniforms);
  }
  pcVar11 = "Fail";
  if ((local_248 & 1) != 0) {
    pcVar11 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~(byte)local_248 & QP_TEST_RESULT_FAIL,pcVar11);
  pvVar4 = (void *)CONCAT44(types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&resultTypes._M_t);
  operator_delete(local_238,100);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBufferActiveUniformValidation::iterate(void)
{
	/* Initialize */
	initTest();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool testResult = true;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	/* Configure Program */
	configureProgram(&m_texture_params, m_tbo_tex_ids);

	/* Get number of active uniforms for current program */
	glw::GLint n_active_uniforms;

	gl.getProgramiv(m_po_id, GL_ACTIVE_UNIFORMS, &n_active_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting value of GL_ACTIVE_UNIFORMS!");

	if ((glw::GLuint)n_active_uniforms != m_texture_params.size())
	{
		/* Log error if number of active uniforms different than expected */
		m_testCtx.getLog() << tcu::TestLog::Message << "Result is different than expected!\n"
						   << "Expected number of active uniforms: " << m_texture_params.size() << "\n"
						   << "Result   number of active uniforms: " << n_active_uniforms << "\n"
						   << tcu::TestLog::EndMessage;

		testResult = false;
	}

	/* Retrieve parameters for specific indices */
	std::vector<glw::GLchar> nameValue(m_param_value_size);
	glw::GLsizei			 paramLength = 0;
	glw::GLsizei			 uniformSize = 0;
	glw::GLenum				 uniformType;

	/* store map of indices and uniform types */
	std::map<glw::GLuint, glw::GLenum> resultTypes;

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		gl.getActiveUniform(m_po_id, i /* index */, (glw::GLsizei)(m_param_value_size - 1), &paramLength, &uniformSize,
							&uniformType, &nameValue[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about active uniform variable!");

		/*Check if returned uniform type is one of types defined in current program*/
		const TextureParameters* param = getParamsForType(uniformType);

		if (0 == param)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Following uniform type was not expected to be defined in current program : \n"
							   << getUniformTypeName(uniformType) << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}
		else if (strncmp(&nameValue[0], param->get_uniform_name().c_str(), m_param_value_size))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "For :" << getUniformTypeName(uniformType) << " type name \n"
							   << "expected  uniform name is: " << param->get_uniform_name().c_str() << "\n"
							   << "result    uniform name is: " << &nameValue[0] << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}

		resultTypes[i] = uniformType;
	}

	/* Check if all uniform types defined in program were returned */
	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		/* Log error if expected uniform type is missing */
		std::map<glw::GLuint, glw::GLenum>::iterator it = resultTypes.begin();
		for (; it != resultTypes.end(); ++it)
		{
			if (it->second == m_texture_params[i].get_texture_uniform_type())
			{
				break;
			}
		}

		/* Log if there is some missing uniform type */
		if (it == resultTypes.end())
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Following uniform type is missing from active uniforms list: "
							   << getUniformTypeName(m_texture_params[i].get_texture_uniform_type()) << "\n"
							   << tcu::TestLog::EndMessage;

			testResult = false;
		}
	}

	/* Get all active uniform types using glGetActiveUniformsiv and compare with results from glGetActiveUniform function */
	std::vector<glw::GLuint> indicies(n_active_uniforms);
	std::vector<glw::GLint>  types(n_active_uniforms);

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		indicies[i] = i;
	}

	gl.getActiveUniformsiv(m_po_id, n_active_uniforms, &indicies[0], GL_UNIFORM_TYPE, &types[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about active uniform variables!");

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		/* Log error if expected result is different from expected*/
		if (resultTypes[i] != (glw::GLuint)types[i])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong uniform type for index(" << i << ")\n"
							   << "expected uniform type: " << getUniformTypeName(resultTypes[i]) << "\n"
							   << "result   uniform type: " << getUniformTypeName(types[i]) << "\n"
							   << tcu::TestLog::EndMessage;

			testResult = false;
		}
	}

	glw::GLenum paramVal = GL_TYPE;
	glw::GLint  type	 = -1;

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		gl.getProgramResourceiv(m_po_id, GL_UNIFORM, i /*index */, 1 /* parameters count */,
								&paramVal /* parameter enum */, 1 /* buffer size */, 0, &type);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about one of program resources!");

		if (resultTypes[i] != (glw::GLuint)type)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong uniform type for index(" << i << ")\n"
							   << "expected uniform type: " << getUniformTypeName(resultTypes[i]) << "\n"
							   << "result   uniform type: " << getUniformTypeName(type) << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}